

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Abc_ObjReplaceByConstant(Abc_Obj_t *pNode,int fConst1)

{
  int iVar1;
  Abc_Obj_t *local_28;
  Abc_Obj_t *pNodeNew;
  int fConst1_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NtkIsLogic(pNode->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x160,"void Abc_ObjReplaceByConstant(Abc_Obj_t *, int)");
  }
  iVar1 = Abc_ObjIsCo(pNode);
  if (iVar1 == 0) {
    if (fConst1 == 0) {
      local_28 = Abc_NtkCreateNodeConst0(pNode->pNtk);
    }
    else {
      local_28 = Abc_NtkCreateNodeConst1(pNode->pNtk);
    }
    Abc_ObjTransferFanout(pNode,local_28);
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 != 0) {
      Abc_NtkDeleteObj_rec(pNode,1);
    }
    return;
  }
  __assert_fail("!Abc_ObjIsCo(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x161,"void Abc_ObjReplaceByConstant(Abc_Obj_t *, int)");
}

Assistant:

void Abc_ObjReplaceByConstant( Abc_Obj_t * pNode, int fConst1 )
{
    Abc_Obj_t * pNodeNew;
    assert( Abc_NtkIsLogic(pNode->pNtk) );
    assert( !Abc_ObjIsCo(pNode) );
    pNodeNew = fConst1 ? Abc_NtkCreateNodeConst1(pNode->pNtk) : Abc_NtkCreateNodeConst0(pNode->pNtk);
    // transfer the fanouts to the old node
    Abc_ObjTransferFanout( pNode, pNodeNew );
    // remove the old node
    if ( Abc_ObjIsNode(pNode) )
        Abc_NtkDeleteObj_rec( pNode, 1 );
}